

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall asmjit::_abi_1_10::BaseRAPass::insertPrologEpilog(BaseRAPass *this)

{
  BaseCompiler *pBVar1;
  FuncNode *pFVar2;
  LabelNode *node;
  BaseRAPass *in_RDI;
  Error _err_2;
  Error _err_1;
  Error _err;
  FuncFrame *frame;
  FuncArgsAssignment *in_stack_00000598;
  FuncFrame *in_stack_000005a0;
  BaseEmitHelper *in_stack_000005a8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  BaseEmitter *in_stack_ffffffffffffffb8;
  Error local_4;
  
  FuncNode::frame(in_RDI->_func);
  pBVar1 = FuncPass::cc(&in_RDI->super_FuncPass);
  pFVar2 = func(in_RDI);
  BaseBuilder::_setCursor(&pBVar1->super_BaseBuilder,(BaseNode *)pFVar2);
  FuncPass::cc(&in_RDI->super_FuncPass);
  local_4 = BaseEmitter::emitProlog
                      (in_stack_ffffffffffffffb8,
                       (FuncFrame *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if ((local_4 == 0) &&
     (local_4 = BaseEmitHelper::emitArgsAssignment
                          (in_stack_000005a8,in_stack_000005a0,in_stack_00000598), local_4 == 0)) {
    pBVar1 = FuncPass::cc(&in_RDI->super_FuncPass);
    pFVar2 = func(in_RDI);
    node = FuncNode::exitNode(pFVar2);
    BaseBuilder::_setCursor(&pBVar1->super_BaseBuilder,&node->super_BaseNode);
    FuncPass::cc(&in_RDI->super_FuncPass);
    local_4 = BaseEmitter::emitEpilog
                        ((BaseEmitter *)pBVar1,
                         (FuncFrame *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
    ;
    if (local_4 == 0) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

Error BaseRAPass::insertPrologEpilog() noexcept {
  FuncFrame& frame = _func->frame();

  cc()->_setCursor(func());
  ASMJIT_PROPAGATE(cc()->emitProlog(frame));
  ASMJIT_PROPAGATE(_iEmitHelper->emitArgsAssignment(frame, _argsAssignment));

  cc()->_setCursor(func()->exitNode());
  ASMJIT_PROPAGATE(cc()->emitEpilog(frame));

  return kErrorOk;
}